

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_sinks-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::stdout_sink<spdlog::details::console_nullmutex>::stdout_sink
          (stdout_sink<spdlog::details::console_nullmutex> *this)

{
  undefined8 *in_RDI;
  FILE *in_stack_00000018;
  stdout_sink_base<spdlog::details::console_nullmutex> *in_stack_00000020;
  
  stdout_sink_base<spdlog::details::console_nullmutex>::stdout_sink_base
            (in_stack_00000020,in_stack_00000018);
  *in_RDI = &PTR__stdout_sink_00303ea8;
  return;
}

Assistant:

SPDLOG_INLINE stdout_sink<ConsoleMutex>::stdout_sink()
    : stdout_sink_base<ConsoleMutex>(stdout) {}